

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageFieldGenerator::GenerateBuilderMembers
          (ImmutableLazyMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableMessageFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.LazyFieldLite $name$_ =\n    new com.google.protobuf.LazyFieldLite();\n"
                    );
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.SingleFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_builder$;\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  return ($type$) $name$_.getValue($type$.getDefaultInstance());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder set$capitalized_name$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$name$_.setValue(value);\n$on_changed$\n"
             ,(char *)0x0,"$set_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder set$capitalized_name$(\n    $type$.Builder builderForValue)"
             ,"$name$_.setValue(builderForValue.build());\n$on_changed$\n",(char *)0x0,
             "$set_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder merge$capitalized_name$($type$ value)",
             "if ($get_has_field_bit_builder$ &&\n    !$name$_.containsDefaultInstance()) {\n  $name$_.setValue(\n    $type$.newBuilder(\n        get$capitalized_name$()).mergeFrom(value).buildPartial());\n} else {\n  $name$_.setValue(value);\n}\n$on_changed$\n"
             ,(char *)0x0,"$set_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder clear$capitalized_name$()",
             "$name$_.clear();\n$on_changed$\n",(char *)0x0,
             "$clear_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$.Builder get$capitalized_name$Builder() {\n  $set_has_field_bit_builder$;\n  $on_changed$\n  return get$capitalized_name$FieldBuilder().getBuilder();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder() {\n  if ($name$Builder_ != null) {\n    return $name$Builder_.getMessageOrBuilder();\n  } else {\n    return $name$_;\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.SingleFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> \n    get$capitalized_name$FieldBuilder() {\n  if ($name$Builder_ == null) {\n    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder$ver$<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            $name$_,\n            getParentForChildren(),\n            isClean());\n    $name$_ = null;\n  }\n  return $name$Builder_;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.

  printer->Print(variables_,
    "private com.google.protobuf.LazyFieldLite $name$_ =\n"
    "    new com.google.protobuf.LazyFieldLite();\n");

  printer->Print(variables_,
    // If this builder is non-null, it is used and the other fields are
    // ignored.
    "private com.google.protobuf.SingleFieldBuilder$ver$<\n"
    "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
    "\n");

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $get_has_field_bit_builder$;\n"
    "}\n");

    printer->Print(variables_,
      "$deprecation$public $type$ get$capitalized_name$() {\n"
      "  return ($type$) $name$_.getValue($type$.getDefaultInstance());\n"
      "}\n");

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$($type$ value)",

    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "$name$_.setValue(value);\n"
    "$on_changed$\n",

     NULL,  // Lazy fields are supported only for lite-runtime.

    "$set_has_field_bit_builder$;\n"
    "return this;\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    $type$.Builder builderForValue)",

    "$name$_.setValue(builderForValue.build());\n"
    "$on_changed$\n",

    NULL,

    "$set_has_field_bit_builder$;\n"
    "return this;\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder merge$capitalized_name$($type$ value)",

    "if ($get_has_field_bit_builder$ &&\n"
    "    !$name$_.containsDefaultInstance()) {\n"
    "  $name$_.setValue(\n"
    "    $type$.newBuilder(\n"
    "        get$capitalized_name$()).mergeFrom(value).buildPartial());\n"
    "} else {\n"
    "  $name$_.setValue(value);\n"
    "}\n"
    "$on_changed$\n",

    NULL,

    "$set_has_field_bit_builder$;\n"
    "return this;\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder clear$capitalized_name$()",

    "$name$_.clear();\n"
    "$on_changed$\n",

    NULL,

    "$clear_has_field_bit_builder$;\n"
    "return this;\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$.Builder get$capitalized_name$Builder() {\n"
    "  $set_has_field_bit_builder$;\n"
    "  $on_changed$\n"
    "  return get$capitalized_name$FieldBuilder().getBuilder();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder() {\n"
    "  if ($name$Builder_ != null) {\n"
    "    return $name$Builder_.getMessageOrBuilder();\n"
    "  } else {\n"
    "    return $name$_;\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private com.google.protobuf.SingleFieldBuilder$ver$<\n"
    "    $type$, $type$.Builder, $type$OrBuilder> \n"
    "    get$capitalized_name$FieldBuilder() {\n"
    "  if ($name$Builder_ == null) {\n"
    "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder$ver$<\n"
    "        $type$, $type$.Builder, $type$OrBuilder>(\n"
    "            $name$_,\n"
    "            getParentForChildren(),\n"
    "            isClean());\n"
    "    $name$_ = null;\n"
    "  }\n"
    "  return $name$Builder_;\n"
    "}\n");
}